

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock_updates.cc
# Opt level: O1

void __thiscall
tchecker::clock_updates_list_t::absorbing_merge(clock_updates_list_t *this,clock_updates_list_t *l)

{
  undefined4 *puVar1;
  __normal_iterator<const_tchecker::clock_update_t_*,_std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>_>
  __first;
  __normal_iterator<const_tchecker::clock_update_t_*,_std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>_>
  __last;
  undefined8 uVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pcVar5;
  long lVar6;
  ulong __n;
  size_type __n_00;
  clock_update_t *pcVar7;
  clock_update_t *pcVar8;
  clock_update_t *pcVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  pointer pcVar13;
  __normal_iterator<const_tchecker::clock_update_t_*,_std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>_>
  __first_00;
  clock_update_t *pcVar14;
  
  pcVar14 = (this->_list).
            super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((this->_list).
      super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
      _M_impl.super__Vector_impl_data._M_start == pcVar14) {
    pcVar5 = (this->_list).
             super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (this->_list).
             super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pcVar13 = pcVar5;
    if (pcVar3 != pcVar5) {
      do {
        p_Var4 = (pcVar13->_value).
                 super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        pcVar13 = pcVar13 + 1;
      } while (pcVar13 != pcVar3);
      (this->_list).
      super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
      _M_impl.super__Vector_impl_data._M_finish = pcVar5;
    }
    return;
  }
  __first._M_current =
       (l->_list).
       super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
       _M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (l->_list).
       super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current == __last._M_current) {
    std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>::clear
              (&this->_list);
    return;
  }
  if (__first._M_current != __last._M_current) {
    uVar11 = (long)__last._M_current - (long)__first._M_current;
    lVar6 = (long)uVar11 >> 3;
    __n = lVar6 * -0x5555555555555555;
    pcVar7 = (this->_list).
             super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (uVar11 <= (ulong)((long)(this->_list).
                                super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pcVar7))
    {
      lVar10 = (long)pcVar7 - (long)pcVar14 >> 3;
      if (__n < (ulong)(lVar10 * -0x5555555555555555)) {
        if (__last._M_current != __first._M_current) {
          lVar10 = lVar6 * -8;
          lVar12 = 0;
          do {
            *(undefined4 *)((long)&pcVar7->_clock_id + lVar12) =
                 *(undefined4 *)((long)pcVar7 + lVar12 + lVar10);
            *(undefined8 *)
             ((long)&(pcVar7->_value).
                     super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr + lVar12) = *(undefined8 *)((long)pcVar7 + lVar12 + lVar10 + 8);
            *(undefined8 *)
             ((long)&(pcVar7->_value).
                     super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + lVar12) = 0;
            uVar2 = *(undefined8 *)((long)pcVar7 + lVar12 + lVar10 + 0x10);
            *(undefined8 *)((long)pcVar7 + lVar12 + lVar10 + 0x10) = 0;
            *(undefined8 *)
             ((long)&(pcVar7->_value).
                     super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + lVar12) = uVar2;
            *(undefined8 *)((long)pcVar7 + lVar12 + lVar10 + 8) = 0;
            lVar12 = lVar12 + 0x18;
          } while (lVar12 != lVar6 * 8);
        }
        (this->_list).
        super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)(uVar11 + (long)pcVar7);
        std::__copy_move_backward<true,false,std::random_access_iterator_tag>::
        __copy_move_b<tchecker::clock_update_t*,tchecker::clock_update_t*>
                  (pcVar14,(clock_update_t *)((long)pcVar7 + lVar6 * -8),pcVar7);
        __first_00._M_current = __last._M_current;
      }
      else {
        __first_00._M_current = ((long)pcVar7 - (long)pcVar14) + __first._M_current;
        std::__uninitialized_copy<false>::
        __uninit_copy<__gnu_cxx::__normal_iterator<tchecker::clock_update_t_const*,std::vector<tchecker::clock_update_t,std::allocator<tchecker::clock_update_t>>>,tchecker::clock_update_t*>
                  (__first_00,__last,pcVar7);
        pcVar3 = (this->_list).
                 super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pcVar5 = pcVar3 + __n + lVar10 * 0x5555555555555555;
        (this->_list).
        super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
        _M_impl.super__Vector_impl_data._M_finish = pcVar5;
        if (pcVar7 != pcVar14) {
          lVar6 = 0;
          do {
            puVar1 = (undefined4 *)((long)&pcVar14->_clock_id + lVar6);
            *(undefined4 *)((long)&pcVar5->_clock_id + lVar6) = *puVar1;
            *(undefined8 *)
             ((long)&(pcVar5->_value).
                     super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr + lVar6) = *(undefined8 *)(puVar1 + 2);
            *(undefined8 *)
             ((long)&(pcVar5->_value).
                     super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + lVar6) = 0;
            uVar2 = *(undefined8 *)(puVar1 + 4);
            *(undefined8 *)(puVar1 + 4) = 0;
            *(undefined8 *)
             ((long)&(pcVar5->_value).
                     super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + lVar6) = uVar2;
            *(undefined8 *)(puVar1 + 2) = 0;
            lVar6 = lVar6 + 0x18;
          } while ((clock_update_t *)(puVar1 + 6) != pcVar7);
        }
        (this->_list).
        super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)((long)pcVar3 + uVar11);
      }
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<tchecker::clock_update_t_const*,tchecker::clock_update_t*>
                (__first._M_current,__first_00._M_current,pcVar14);
      return;
    }
    __n_00 = std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>::
             _M_check_len(&this->_list,__n,"vector::_M_range_insert");
    if (__n_00 == 0) {
      pcVar7 = (clock_update_t *)0x0;
    }
    else {
      pcVar7 = __gnu_cxx::new_allocator<tchecker::clock_update_t>::allocate
                         ((new_allocator<tchecker::clock_update_t> *)this,__n_00,(void *)0x0);
    }
    pcVar9 = pcVar7;
    for (pcVar8 = (this->_list).
                  super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
                  ._M_impl.super__Vector_impl_data._M_start; pcVar8 != pcVar14; pcVar8 = pcVar8 + 1)
    {
      pcVar9->_clock_id = pcVar8->_clock_id;
      (pcVar9->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (pcVar8->_value).
               super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (pcVar9->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var4 = (pcVar8->_value).
               super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (pcVar8->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (pcVar9->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var4;
      (pcVar8->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      pcVar9 = pcVar9 + 1;
    }
    pcVar9 = std::__uninitialized_copy<false>::
             __uninit_copy<__gnu_cxx::__normal_iterator<tchecker::clock_update_t_const*,std::vector<tchecker::clock_update_t,std::allocator<tchecker::clock_update_t>>>,tchecker::clock_update_t*>
                       (__first,__last,pcVar9);
    pcVar8 = (this->_list).
             super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (; pcVar8 != pcVar14; pcVar14 = pcVar14 + 1) {
      pcVar9->_clock_id = pcVar14->_clock_id;
      (pcVar9->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (pcVar14->_value).
               super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (pcVar9->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var4 = (pcVar14->_value).
               super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (pcVar14->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (pcVar9->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var4;
      (pcVar14->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      pcVar9 = pcVar9 + 1;
    }
    for (pcVar14 = (this->_list).
                   super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
                   ._M_impl.super__Vector_impl_data._M_start; pcVar14 != pcVar8;
        pcVar14 = pcVar14 + 1) {
      p_Var4 = (pcVar14->_value).
               super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
    }
    pcVar5 = (this->_list).
             super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pcVar5 != (pointer)0x0) {
      operator_delete(pcVar5,(long)(this->_list).
                                   super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pcVar5
                     );
    }
    (this->_list).
    super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>._M_impl.
    super__Vector_impl_data._M_start = pcVar7;
    (this->_list).
    super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar9;
    (this->_list).
    super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pcVar7 + __n_00;
  }
  return;
}

Assistant:

void clock_updates_list_t::absorbing_merge(tchecker::clock_updates_list_t const & l)
{
  if (empty() || l.empty())
    clear();
  else
    _list.insert(_list.end(), l.begin(), l.end());
}